

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::LessEqual(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  BOOL BVar4;
  double dVar5;
  double dVar6;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  
  bVar1 = TaggedInt::Is(aLeft);
  if (bVar1) {
    bVar1 = TaggedInt::Is(aRight);
    if (bVar1) {
      iVar2 = ::Math::PointerCastToIntegralTruncate<int>(aLeft);
      iVar3 = ::Math::PointerCastToIntegralTruncate<int>(aRight);
      return (uint)(iVar2 <= iVar3);
    }
    bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(aRight);
    if (bVar1) {
      dVar5 = TaggedInt::ToDouble(aLeft);
      dVar6 = JavascriptNumber::GetValue(aRight);
      return (uint)(dVar5 <= dVar6);
    }
  }
  else {
    bVar1 = TaggedInt::Is(aRight);
    if (bVar1) {
      bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(aLeft);
      if (bVar1) {
        dVar5 = JavascriptNumber::GetValue(aLeft);
        dVar6 = TaggedInt::ToDouble(aRight);
        return (uint)(dVar5 <= dVar6);
      }
    }
    else {
      bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(aLeft);
      if ((bVar1) && (bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(aRight), bVar1)) {
        dVar5 = JavascriptNumber::GetValue(aLeft);
        dVar6 = JavascriptNumber::GetValue(aRight);
        return (uint)(dVar5 <= dVar6);
      }
    }
  }
  BVar4 = RelationalComparisonHelper(aRight,aLeft,scriptContext,false,true);
  return (uint)((BVar4 != 0 ^ 0xffU) & 1);
}

Assistant:

BOOL JavascriptOperators::LessEqual(Var aLeft, Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_LessEqual);
        if (TaggedInt::Is(aLeft))
        {
            if (TaggedInt::Is(aRight))
            {
                // Works whether it is TaggedInt31 or TaggedInt32
                return ::Math::PointerCastToIntegralTruncate<int>(aLeft) <= ::Math::PointerCastToIntegralTruncate<int>(aRight);
            }

            if (JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return TaggedInt::ToDouble(aLeft) <= JavascriptNumber::GetValue(aRight);
            }
        }
        else if (TaggedInt::Is(aRight))
        {
            if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft))
            {
                return JavascriptNumber::GetValue(aLeft) <= TaggedInt::ToDouble(aRight);
            }
        }
        else
        {
            if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft) && JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return JavascriptNumber::GetValue(aLeft) <= JavascriptNumber::GetValue(aRight);
            }
        }

        return !RelationalComparisonHelper(aRight, aLeft, scriptContext, false, true);
        JIT_HELPER_END(Op_LessEqual);
    }